

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O0

void anon_unknown.dwarf_2fa16::assert_true_msg(void)

{
  string expected;
  string msg;
  TestFailure *e;
  allocator local_49;
  string local_48 [48];
  Assert local_18;
  
  UnitTests::Assert::Assert
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0xb4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Extra message",&local_49);
  UnitTests::Assert::True(&local_18,(string *)local_48,false);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  UnitTests::Assert::Assert
            ((Assert *)&e,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0xb5);
  UnitTests::Assert::Fail((Assert *)&e);
}

Assistant:

TEST(assert_true_msg)
    {
        try
        {
            ASSERT_TRUE("Extra message", 1 == 2);
            FAIL();
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure : Extra message Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from failing ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }